

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeof_struct.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"(short int) : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1," byte");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(int) : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
  poVar1 = std::operator<<(poVar1," byte");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(st1) : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
  poVar1 = std::operator<<(poVar1," byte");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(st2) : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x10);
  poVar1 = std::operator<<(poVar1," byte");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    std::cout << "(short int) : " << sizeof(int16_t) << " byte" << std::endl;
    std::cout << "(int) : " << sizeof(int32_t) << " byte" << std::endl;
    std::cout << "(st1) : " << sizeof(st1) << " byte" << std::endl;
    std::cout << "(st2) : " << sizeof(st2) << " byte" << std::endl;

    return 0;
}